

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall
ComponentManager::CreateInstance(ComponentManager *this,CID cid,IID iid,void **object)

{
  IID IVar1;
  long *local_38;
  IFactory *factory;
  void **ppvStack_28;
  ErrorCode result;
  void **object_local;
  ComponentManager *this_local;
  IID iid_local;
  CID cid_local;
  
  factory._4_4_ = 0;
  ppvStack_28 = object;
  object_local = (void **)this;
  this_local = (ComponentManager *)iid.mId;
  iid_local.mId = cid.mId;
  IVar1 = JHCOM::IFactory::getIID();
  factory._4_4_ =
       (*(this->super_IComponentManager).super_ISupports._vptr_ISupports[10])
                 (this,cid.mId,IVar1.mId,&local_38);
  if (factory._4_4_ == 0) {
    factory._4_4_ = (**(code **)(*local_38 + 0x28))(local_38,iid_local.mId,this_local,ppvStack_28);
    (**(code **)(*local_38 + 8))();
  }
  else {
    factory._4_4_ = kNoFactory;
  }
  return factory._4_4_;
}

Assistant:

ErrorCode ComponentManager::CreateInstance( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;	
	IFactory *factory;
	
	result = GetService( cid, IFactory::getIID(), (void**)&factory );
	
	LOG( "GetService result %d", result );
	
	if ( result == kNoError )
	{
		result = factory->CreateInstance( cid, iid, object );
		factory->Release();
	}
	else
		result = kNoFactory;

	return result;	
}